

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManChoiceLevel_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  Tim_Man_t *p_00;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  int Fill;
  int Fill_00;
  int Fill_01;
  int Fill_02;
  int Fill_03;
  int Fill_04;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  int *extraout_RDX_03;
  int *extraout_RDX_04;
  int *extraout_RDX_05;
  int *extraout_RDX_06;
  Gia_Obj_t *pGVar9;
  long lVar10;
  ulong uVar11;
  int local_40;
  int *piVar8;
  
  pGVar1 = p->pObjs;
  if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_006bc149;
  iVar3 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
  if (p->nTravIdsAlloc <= iVar3) {
    __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x229,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
  }
  uVar5 = p->nTravIds;
  piVar8 = (int *)(ulong)uVar5;
  if (p->pTravIds[iVar3] == uVar5) {
    return;
  }
  p_00 = (Tim_Man_t *)p->pManTime;
  p->pTravIds[iVar3] = uVar5;
  uVar11 = *(ulong *)pObj;
  uVar5 = (uint)uVar11;
  if ((~uVar5 & 0x9fffffff) == 0) {
    local_40 = 0;
    if ((p_00 != (Tim_Man_t *)0x0) &&
       (iVar3 = Tim_ManBoxForCi(p_00,(uint)(uVar11 >> 0x20) & 0x1fffffff), piVar8 = extraout_RDX,
       -1 < iVar3)) {
      iVar4 = Tim_ManBoxInputFirst(p_00,iVar3);
      uVar5 = Tim_ManBoxInputNum(p_00,iVar3);
      if ((int)uVar5 < 1) {
        local_40 = 1;
        piVar8 = extraout_RDX_00;
      }
      else {
        lVar10 = (long)iVar4;
        uVar11 = (ulong)uVar5;
        local_40 = 0;
        do {
          if ((iVar4 < 0) || (p->vCos->nSize <= lVar10)) goto LAB_006bc12a;
          iVar3 = p->vCos->pArray[lVar10];
          if (((long)iVar3 < 0) || (p->nObjs <= iVar3)) goto LAB_006bc168;
          pGVar9 = p->pObjs + iVar3;
          Gia_ManChoiceLevel_rec(p,pGVar9);
          pGVar1 = p->pObjs;
          if ((pGVar9 < pGVar1) || (pGVar1 + p->nObjs <= pGVar9)) goto LAB_006bc149;
          uVar5 = (int)((long)pGVar9 - (long)pGVar1 >> 2) * -0x55555555;
          pVVar2 = p->vLevels;
          Vec_IntFillExtra(pVVar2,uVar5 + 1,Fill);
          if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
          piVar8 = extraout_RDX_01;
          if (local_40 < pVVar2->pArray[uVar5 & 0x7fffffff]) {
            pGVar1 = p->pObjs;
            if ((pGVar9 < pGVar1) || (pGVar1 + p->nObjs <= pGVar9)) goto LAB_006bc149;
            uVar5 = (int)((long)pGVar9 - (long)pGVar1 >> 2) * -0x55555555;
            pVVar2 = p->vLevels;
            Vec_IntFillExtra(pVVar2,uVar5 + 1,(int)extraout_RDX_01);
            if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
            local_40 = pVVar2->pArray[uVar5 & 0x7fffffff];
            piVar8 = extraout_RDX_02;
          }
          lVar10 = lVar10 + 1;
          uVar11 = uVar11 - 1;
        } while (uVar11 != 0);
        local_40 = local_40 + 1;
      }
    }
  }
  else {
    uVar6 = uVar11 & 0x1fffffff;
    if (uVar6 == 0x1fffffff || -1 < (int)uVar5) {
      bVar7 = (int)uVar5 < 0 || (int)uVar6 == 0x1fffffff;
      piVar8 = (int *)CONCAT71(0x1fffff,bVar7);
      if (bVar7) {
        if ((~uVar11 & 0x1fffffff1fffffff) != 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaIf.c"
                        ,0x2c1,"void Gia_ManChoiceLevel_rec(Gia_Man_t *, Gia_Obj_t *)");
        }
LAB_006bbef7:
        local_40 = 0;
      }
      else {
        pGVar1 = pObj + -uVar6;
        Gia_ManChoiceLevel_rec(p,pGVar1);
        pGVar9 = p->pObjs;
        if ((pGVar1 < pGVar9) || (pGVar9 + p->nObjs <= pGVar1)) goto LAB_006bc149;
        uVar5 = (int)((long)pGVar1 - (long)pGVar9 >> 2) * -0x55555555;
        pVVar2 = p->vLevels;
        Vec_IntFillExtra(pVVar2,uVar5 + 1,Fill_01);
        if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
        if (pVVar2->pArray[uVar5 & 0x7fffffff] < 1) {
          local_40 = 0;
        }
        else {
          pGVar9 = p->pObjs;
          if ((pGVar1 < pGVar9) || (pGVar9 + p->nObjs <= pGVar1)) goto LAB_006bc149;
          uVar5 = (int)((long)pGVar1 - (long)pGVar9 >> 2) * -0x55555555;
          pVVar2 = p->vLevels;
          Vec_IntFillExtra(pVVar2,uVar5 + 1,Fill_02);
          if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
          local_40 = pVVar2->pArray[uVar5 & 0x7fffffff];
        }
        pGVar1 = pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff);
        Gia_ManChoiceLevel_rec(p,pGVar1);
        pGVar9 = p->pObjs;
        if ((pGVar1 < pGVar9) || (pGVar9 + p->nObjs <= pGVar1)) goto LAB_006bc149;
        uVar5 = (int)((long)pGVar1 - (long)pGVar9 >> 2) * -0x55555555;
        pVVar2 = p->vLevels;
        Vec_IntFillExtra(pVVar2,uVar5 + 1,Fill_03);
        if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) {
LAB_006bc12a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if (local_40 < pVVar2->pArray[uVar5 & 0x7fffffff]) {
          local_40 = Gia_ObjLevel(p,pGVar1);
        }
        pGVar1 = p->pObjs;
        if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_006bc149;
        local_40 = local_40 + 1;
        piVar8 = p->pSibls;
        if (piVar8 != (int *)0x0) {
          uVar5 = piVar8[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555];
          piVar8 = (int *)(ulong)uVar5;
          if (piVar8 != (int *)0x0) {
            if (((int)uVar5 < 0) || (p->nObjs <= (int)uVar5)) {
LAB_006bc168:
              __assert_fail("v >= 0 && v < p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                            ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
            }
            pGVar1 = pGVar1 + (long)piVar8;
            Gia_ManChoiceLevel_rec(p,pGVar1);
            pGVar9 = p->pObjs;
            if ((pGVar1 < pGVar9) || (pGVar9 + p->nObjs <= pGVar1)) goto LAB_006bc149;
            uVar5 = (int)((long)pGVar1 - (long)pGVar9 >> 2) * -0x55555555;
            pVVar2 = p->vLevels;
            Vec_IntFillExtra(pVVar2,uVar5 + 1,Fill_04);
            if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
            piVar8 = extraout_RDX_05;
            if (local_40 < pVVar2->pArray[uVar5 & 0x7fffffff]) {
              local_40 = Gia_ObjLevel(p,pGVar1);
              piVar8 = extraout_RDX_06;
            }
          }
        }
      }
    }
    else {
      pGVar1 = pObj + -uVar6;
      Gia_ManChoiceLevel_rec(p,pGVar1);
      pGVar9 = p->pObjs;
      if ((pGVar1 < pGVar9) || (pGVar9 + p->nObjs <= pGVar1)) goto LAB_006bc149;
      uVar5 = (int)((long)pGVar1 - (long)pGVar9 >> 2) * -0x55555555;
      pVVar2 = p->vLevels;
      Vec_IntFillExtra(pVVar2,uVar5 + 1,Fill_00);
      if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
      piVar8 = extraout_RDX_03;
      if (pVVar2->pArray[uVar5 & 0x7fffffff] < 1) goto LAB_006bbef7;
      pGVar9 = p->pObjs;
      if ((pGVar1 < pGVar9) || (pGVar9 + p->nObjs <= pGVar1)) goto LAB_006bc149;
      uVar5 = (int)((long)pGVar1 - (long)pGVar9 >> 2) * -0x55555555;
      pVVar2 = p->vLevels;
      Vec_IntFillExtra(pVVar2,uVar5 + 1,(int)extraout_RDX_03);
      if (((int)uVar5 < 0) || (pVVar2->nSize <= (int)uVar5)) goto LAB_006bc12a;
      local_40 = pVVar2->pArray[uVar5 & 0x7fffffff];
      piVar8 = extraout_RDX_04;
    }
  }
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pObj) && (pObj < pGVar1 + p->nObjs)) {
    uVar5 = (int)((long)pObj - (long)pGVar1 >> 2) * -0x55555555;
    pVVar2 = p->vLevels;
    Vec_IntFillExtra(pVVar2,uVar5 + 1,(int)piVar8);
    if ((-1 < (int)uVar5) && ((int)uVar5 < pVVar2->nSize)) {
      pVVar2->pArray[uVar5 & 0x7fffffff] = local_40;
      return;
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
LAB_006bc149:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManChoiceLevel_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Gia_Obj_t * pNext;
    int i, iBox, iTerm1, nTerms, LevelMax = 0;
    if ( Gia_ObjIsTravIdCurrent( p, pObj ) )
        return;
    Gia_ObjSetTravIdCurrent( p, pObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( pManTime )
        {
            iBox = Tim_ManBoxForCi( pManTime, Gia_ObjCioId(pObj) );
            if ( iBox >= 0 ) // this is not a true PI
            {
                iTerm1 = Tim_ManBoxInputFirst( pManTime, iBox );
                nTerms = Tim_ManBoxInputNum( pManTime, iBox );
                for ( i = 0; i < nTerms; i++ )
                {
                    pNext = Gia_ManCo( p, iTerm1 + i );
                    Gia_ManChoiceLevel_rec( p, pNext );
                    if ( LevelMax < Gia_ObjLevel(p, pNext) )
                        LevelMax = Gia_ObjLevel(p, pNext);
                }
                LevelMax++;
            }
        }
//        Abc_Print( 1, "%d ", pObj->Level );
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
    }
    else if ( Gia_ObjIsAnd(pObj) )
    { 
        // get the maximum level of the two fanins
        pNext = Gia_ObjFanin0(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        pNext = Gia_ObjFanin1(pObj);
        Gia_ManChoiceLevel_rec( p, pNext );
        if ( LevelMax < Gia_ObjLevel(p, pNext) )
            LevelMax = Gia_ObjLevel(p, pNext);
        LevelMax++;

        // get the level of the nodes in the choice node
        if ( (pNext = Gia_ObjSiblObj(p, Gia_ObjId(p, pObj))) )
        {
            Gia_ManChoiceLevel_rec( p, pNext );
            if ( LevelMax < Gia_ObjLevel(p, pNext) )
                LevelMax = Gia_ObjLevel(p, pNext);
        }
    }
    else if ( !Gia_ObjIsConst0(pObj) )
        assert( 0 );
    Gia_ObjSetLevel( p, pObj, LevelMax );
}